

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O3

ByteData * __thiscall
cfd::core::ByteData::Concat<cfd::core::ByteData160,cfd::core::ByteData256>
          (ByteData *__return_storage_ptr__,ByteData *this,ByteData160 *top,ByteData256 *args)

{
  ByteData result;
  ByteData local_30;
  
  Concat<cfd::core::ByteData160>(&local_30,this,top);
  Concat<cfd::core::ByteData256>(__return_storage_ptr__,&local_30,args);
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Concat(const ByteTop& top, const ByteDataClass&... args) const {
    ByteData result = Concat(top);
    return result.Concat(args...);
  }